

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ParserResult * __thiscall
Catch::Clara::Detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jbaldwin[P]libcappuccino/test/catch.cpp:3002:34)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jbaldwin[P]libcappuccino_test_catch_cpp:3002:34)>
          *this,string *arg)

{
  long lVar1;
  ConfigData *pCVar2;
  pointer pRVar3;
  undefined8 __k;
  int iVar4;
  ReporterSpec *spec;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar5;
  undefined4 extraout_var;
  const_iterator cVar6;
  undefined8 *puVar7;
  pointer pRVar8;
  char *pcVar9;
  uint uVar10;
  _Alloc_hider _Var11;
  StringRef reporterSpec;
  size_type __dnew;
  size_type __dnew_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  Optional<Catch::ReporterSpec> parsed;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined **local_f0;
  undefined8 local_e8;
  undefined1 *local_e0;
  undefined8 local_d8;
  undefined1 local_d0;
  undefined7 uStack_cf;
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0 [8];
  
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_assign((string *)&local_110);
  local_e8 = 0;
  local_f0 = &PTR__BasicResult_00246fb8;
  local_d8 = 0;
  local_d0 = 0;
  local_e0 = &local_d0;
  if (local_110._M_string_length == 0) {
    local_150._M_dataplus._M_p = (pointer)0x1d;
    local_c0._0_8_ = local_b0;
    local_c0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_c0,(ulong)&local_150);
    local_b0[0]._M_allocated_capacity = local_150._M_dataplus._M_p;
    builtin_strncpy((char *)(local_c0._0_8_ + 0xd),"y report",8);
    builtin_strncpy((char *)(local_c0._0_8_ + 0x15),"er spec.",8);
    *(undefined8 *)local_c0._0_8_ = 0x6465766965636552;
    builtin_strncpy((char *)(local_c0._0_8_ + 8)," empty r",8);
    local_c0._8_8_ = local_150._M_dataplus._M_p;
    local_150._M_dataplus._M_p[local_c0._0_8_] = '\0';
    BasicResult<Catch::Clara::ParseResultType>::BasicResult
              (__return_storage_ptr__,RuntimeError,(string *)local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._0_8_ != local_b0) {
      operator_delete((void *)local_c0._0_8_,(ulong)(local_b0[0]._M_allocated_capacity + 1));
    }
    goto LAB_00147008;
  }
  reporterSpec.m_size = local_110._M_string_length;
  reporterSpec.m_start = local_110._M_dataplus._M_p;
  parseReporterSpec((Optional<Catch::ReporterSpec> *)local_c0,reporterSpec);
  __k = local_c0._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._0_8_ ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::operator+(&local_130,"Could not parse reporter spec \'",&local_110);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    pcVar9 = (char *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar9) {
      local_150.field_2._M_allocated_capacity = *(undefined8 *)pcVar9;
      local_150.field_2._8_8_ = puVar7[3];
    }
    else {
      local_150.field_2._M_allocated_capacity = *(undefined8 *)pcVar9;
      local_150._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_150._M_string_length = puVar7[1];
    *puVar7 = pcVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    BasicResult<Catch::Clara::ParseResultType>::BasicResult
              (__return_storage_ptr__,RuntimeError,&local_150);
LAB_00146fc9:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,
                      (ulong)(local_150.field_2._M_allocated_capacity + 1));
    }
    _Var11._M_p = local_130._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
LAB_00146ff3:
      operator_delete(_Var11._M_p,(ulong)(local_130.field_2._M_allocated_capacity + 1));
    }
  }
  else {
    pSVar5 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar4 = (*(pSVar5->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar5);
    lVar1 = *(long *)CONCAT44(extraout_var,iVar4);
    if (lVar1 == 0) {
      __assert_fail("m_ptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/jbaldwin[P]libcappuccino/test/catch.hpp"
                    ,0x389,
                    "const T *Catch::Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->() const [T = Catch::ReporterRegistry::ReporterRegistryImpl]"
                   );
    }
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
                    *)(lVar1 + 0x18),(key_type *)__k);
    if (cVar6._M_node == (_Base_ptr)(lVar1 + 0x20)) {
      std::operator+(&local_130,"Unrecognized reporter, \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      pcVar9 = (char *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar9) {
        local_150.field_2._M_allocated_capacity = *(undefined8 *)pcVar9;
        local_150.field_2._8_8_ = puVar7[3];
      }
      else {
        local_150.field_2._M_allocated_capacity = *(undefined8 *)pcVar9;
        local_150._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_150._M_string_length = puVar7[1];
      *puVar7 = pcVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      BasicResult<Catch::Clara::ParseResultType>::BasicResult
                (__return_storage_ptr__,RuntimeError,&local_150);
      goto LAB_00146fc9;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      __assert_fail("nullableValue",
                    "/workspace/llm4binary/github/license_c_cmakelists/jbaldwin[P]libcappuccino/test/catch.hpp"
                    ,0xe93,
                    "T &Catch::Optional<Catch::ReporterSpec>::operator*() [T = Catch::ReporterSpec]"
                   );
    }
    lVar1 = *(long *)(__k + 0x20);
    std::vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>::
    emplace_back<Catch::ReporterSpec>
              (&((this->m_lambda).config)->reporterSpecifications,(ReporterSpec *)local_c0._0_8_);
    if (lVar1 == 0) {
      pCVar2 = (this->m_lambda).config;
      pRVar8 = (pCVar2->reporterSpecifications).
               super__Vector_base<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>._M_impl
               .super__Vector_impl_data._M_start;
      pRVar3 = (pCVar2->reporterSpecifications).
               super__Vector_base<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>._M_impl
               .super__Vector_impl_data._M_finish;
      if (pRVar8 == pRVar3) goto LAB_00146d4d;
      uVar10 = 0;
      do {
        uVar10 = uVar10 + ((pRVar8->m_outputFileName).nullableValue ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pRVar8 = pRVar8 + 1;
      } while (pRVar8 != pRVar3);
      if (uVar10 < 2) goto LAB_00146d4d;
      local_130._M_dataplus._M_p = (pointer)0x33;
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      local_150._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_150,(ulong)&local_130);
      local_150.field_2._M_allocated_capacity = (size_type)local_130._M_dataplus._M_p;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x20) = 'c';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x21) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x22) = 'f';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x23) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x24) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x25) = 'd';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x26) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x27) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x28) = 'u';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x29) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x2a) = 'p';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x2b) = 'u';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x2c) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x2d) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x2e) = 'f';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x2f) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x10) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x11) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x12) = 'm';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x13) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x14) = 'y';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x15) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x16) = 'h';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x17) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x18) = 'v';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x19) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x1a) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x1b) = 'u';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x1c) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x1d) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x1e) = 'p';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x1f) = 'e';
      *(undefined8 *)local_150._M_dataplus._M_p = 0x656e6f20796c6e4f;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 8) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 9) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 10) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0xb) = 'p';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0xc) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0xd) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0xe) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0xf) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x2f) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x30) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x31) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p + 0x32) = '.';
      local_150._M_string_length = (size_type)local_130._M_dataplus._M_p;
      local_150._M_dataplus._M_p[(long)local_130._M_dataplus._M_p] = '\0';
      BasicResult<Catch::Clara::ParseResultType>::BasicResult
                (__return_storage_ptr__,RuntimeError,&local_150);
      local_130.field_2._M_allocated_capacity = local_150.field_2._M_allocated_capacity;
      _Var11._M_p = local_150._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p == &local_150.field_2) goto LAB_00146ffb;
      goto LAB_00146ff3;
    }
LAB_00146d4d:
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    _vptr_ResultBase = (_func_int **)&PTR__BasicResult_00246fb8;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
LAB_00146ffb:
  Optional<Catch::ReporterSpec>::reset((Optional<Catch::ReporterSpec> *)local_c0);
LAB_00147008:
  local_f0 = &PTR__BasicResult_00246fb8;
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,
                    CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                             local_110.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const& arg )
                    -> ParserResult override {
                    return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>(
                        m_lambda, arg );
                }